

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::DescriptorProto::IsInitialized(DescriptorProto *this)

{
  MessageOptions *pMVar1;
  bool bVar2;
  
  bVar2 = internal::
          AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                    (&this->field_);
  if ((((!bVar2) ||
       (bVar2 = internal::
                AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>>
                          (&this->nested_type_), !bVar2)) ||
      (bVar2 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>>
                         (&this->enum_type_), !bVar2)) ||
     ((bVar2 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>>
                         (&this->extension_), !bVar2 ||
      (bVar2 = internal::
               AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>>
                         (&this->oneof_decl_), !bVar2)))) {
    return false;
  }
  if (((this->_has_bits_).has_bits_[0] & 2) != 0) {
    pMVar1 = this->options_;
    bVar2 = internal::ExtensionSet::IsInitialized(&pMVar1->_extensions_);
    if (!bVar2) {
      return false;
    }
    bVar2 = internal::
            AllAreInitialized<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption>>
                      (&pMVar1->uninterpreted_option_);
    if (!bVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DescriptorProto::IsInitialized() const {
  if (!::google::protobuf::internal::AllAreInitialized(this->field())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->nested_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->enum_type())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->extension())) return false;
  if (!::google::protobuf::internal::AllAreInitialized(this->oneof_decl())) return false;
  if (has_options()) {
    if (!this->options_->IsInitialized()) return false;
  }
  return true;
}